

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

string * __thiscall pugi::xml_node::path_abi_cxx11_(xml_node *this,char_t delimiter)

{
  undefined1 *puVar1;
  size_t __n;
  void *__dest;
  undefined1 in_DL;
  long *in_RSI;
  string *in_RDI;
  size_t length;
  xml_node_struct *j;
  xml_node_struct *i;
  size_t offset;
  string_t *result;
  long local_48;
  long local_28;
  
  if (*in_RSI == 0) {
    std::__cxx11::string::string(in_RDI);
  }
  else {
    for (local_28 = *in_RSI; local_28 != 0; local_28 = *(long *)(local_28 + 0x18)) {
      if (*(long *)(local_28 + 8) != 0) {
        impl::anon_unknown_0::strlength((char_t *)0x124166);
      }
    }
    std::__cxx11::string::string(in_RDI);
    std::__cxx11::string::resize((ulong)in_RDI);
    for (local_48 = *in_RSI; local_48 != 0; local_48 = *(long *)(local_48 + 0x18)) {
      if (local_48 != *in_RSI) {
        puVar1 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
        *puVar1 = in_DL;
      }
      if (*(long *)(local_48 + 8) != 0) {
        __n = impl::anon_unknown_0::strlength((char_t *)0x12424a);
        __dest = (void *)std::__cxx11::string::operator[]((ulong)in_RDI);
        memcpy(__dest,*(void **)(local_48 + 8),__n);
      }
    }
  }
  return in_RDI;
}

Assistant:

PUGI__FN string_t xml_node::path(char_t delimiter) const
	{
		if (!_root) return string_t();

		size_t offset = 0;

		for (xml_node_struct* i = _root; i; i = i->parent)
		{
			offset += (i != _root);
			offset += i->name ? impl::strlength(i->name) : 0;
		}

		string_t result;
		result.resize(offset);

		for (xml_node_struct* j = _root; j; j = j->parent)
		{
			if (j != _root)
				result[--offset] = delimiter;

			if (j->name)
			{
				size_t length = impl::strlength(j->name);

				offset -= length;
				memcpy(&result[offset], j->name, length * sizeof(char_t));
			}
		}

		assert(offset == 0);

		return result;
	}